

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildSetupFont
               (ImFontAtlas *atlas,ImFont *font,ImFontConfig *font_config,float ascent,float descent
               )

{
  float descent_local;
  float ascent_local;
  ImFontConfig *font_config_local;
  ImFont *font_local;
  ImFontAtlas *atlas_local;
  
  if ((font_config->MergeMode & 1U) == 0) {
    ImFont::ClearOutputData(font);
    font->FontSize = font_config->SizePixels;
    font->ConfigData = font_config;
    font->ContainerAtlas = atlas;
    font->Ascent = ascent;
    font->Descent = descent;
  }
  font->ConfigDataCount = font->ConfigDataCount + 1;
  return;
}

Assistant:

void ImFontAtlasBuildSetupFont(ImFontAtlas* atlas, ImFont* font, ImFontConfig* font_config, float ascent, float descent)
{
    if (!font_config->MergeMode)
    {
        font->ClearOutputData();
        font->FontSize = font_config->SizePixels;
        font->ConfigData = font_config;
        font->ContainerAtlas = atlas;
        font->Ascent = ascent;
        font->Descent = descent;
    }
    font->ConfigDataCount++;
}